

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_type.cpp
# Opt level: O2

bool __thiscall pstore::brokerface::message_type::operator==(message_type *this,message_type *rhs)

{
  bool bVar1;
  
  if ((((this->sender_id == rhs->sender_id) && (this->message_id == rhs->message_id)) &&
      (this->part_no == rhs->part_no)) && (this->num_parts == rhs->num_parts)) {
    bVar1 = std::operator==(&this->payload,&rhs->payload);
    return bVar1;
  }
  return false;
}

Assistant:

bool message_type::operator== (message_type const & rhs) const {
            return sender_id == rhs.sender_id && message_id == rhs.message_id &&
                   part_no == rhs.part_no && num_parts == rhs.num_parts && payload == rhs.payload;
        }